

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
     deserialize_elems<InputStream>
               (vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *param_1,uint param_2,
               undefined8 *param_3)

{
  pointer ptVar1;
  tuple<int> *elem;
  pointer ptVar2;
  
  std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>::resize(param_1,(ulong)param_2);
  ptVar1 = (param_1->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (ptVar2 = (param_1->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    std::istream::read((char *)*param_3,(long)ptVar2);
  }
  return;
}

Assistant:

static void deserialize_elems(
    std::false_type  /* no insert */,
    Sequence& s, std::uint32_t size, InputStream& istream
  )
  {
    resize(has_resize<Sequence>{}, s, size);

    deserialize_elems_noinsert(
      is_sequence_batch_deserializable<Sequence>{},
      is_proxy_sequence<Sequence>{},
      s, size, istream
    );
  }